

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_wallmarks.cxx
# Opt level: O1

void __thiscall
xray_re::xr_scene_wallmarks::xr_scene_wallmarks(xr_scene_wallmarks *this,xr_scene *scene)

{
  (this->super_xr_scene_part)._vptr_xr_scene_part = (_func_int **)&PTR___cxa_pure_virtual_00249928;
  (this->super_xr_scene_part).m_scene = scene;
  (this->super_xr_scene_part).m_file_name = "wallmark.part";
  (this->super_xr_scene_part).m_chunk_id = SCENE_CHUNK_WALLMARKS;
  xr_scene_revision::xr_scene_revision(&(this->super_xr_scene_part).m_revision);
  (this->super_xr_scene_part)._vptr_xr_scene_part = (_func_int **)&PTR__xr_scene_wallmarks_0024a128;
  this->m_flags = 1;
  this->m_width = 1.0;
  this->m_height = 1.0;
  this->m_rotate = 0.0;
  (this->m_shader)._M_dataplus._M_p = (pointer)&(this->m_shader).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->m_shader,"effects\\wallmarkblend","");
  (this->m_texture)._M_dataplus._M_p = (pointer)&(this->m_texture).field_2;
  (this->m_texture)._M_string_length = 0;
  (this->m_texture).field_2._M_local_buf[0] = '\0';
  (this->m_slots).super__Vector_base<xray_re::wm_slot_le_*,_std::allocator<xray_re::wm_slot_le_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_slots).super__Vector_base<xray_re::wm_slot_le_*,_std::allocator<xray_re::wm_slot_le_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_slots).super__Vector_base<xray_re::wm_slot_le_*,_std::allocator<xray_re::wm_slot_le_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

xr_scene_wallmarks::xr_scene_wallmarks(xr_scene& scene):
	xr_scene_part(scene, "wallmark.part", SCENE_CHUNK_WALLMARKS),
	m_flags(WM_FLAG_DRAW_WALLMARKS),
	m_width(1.f),
	m_height(1.f),
	m_rotate(0),
	m_shader("effects\\wallmarkblend") {}